

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O0

void __thiscall
bssl::HPKETest_SetupRecipientWrongLengthEnc_Test::~HPKETest_SetupRecipientWrongLengthEnc_Test
          (HPKETest_SetupRecipientWrongLengthEnc_Test *this)

{
  HPKETest_SetupRecipientWrongLengthEnc_Test *this_local;
  
  ~HPKETest_SetupRecipientWrongLengthEnc_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HPKETest, SetupRecipientWrongLengthEnc) {
  ScopedEVP_HPKE_KEY key;
  ASSERT_TRUE(EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));

  const uint8_t bogus_enc[X25519_PUBLIC_VALUE_LEN + 5] = {0xff};

  ScopedEVP_HPKE_CTX recipient_ctx;
  ASSERT_FALSE(EVP_HPKE_CTX_setup_recipient(
      recipient_ctx.get(), key.get(), EVP_hpke_hkdf_sha256(),
      EVP_hpke_aes_128_gcm(), bogus_enc, sizeof(bogus_enc), nullptr, 0));
  EXPECT_TRUE(
      ErrorEquals(ERR_get_error(), ERR_LIB_EVP, EVP_R_INVALID_PEER_KEY));
  ERR_clear_error();
}